

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O2

void __thiscall
chrono::utils::ChButterworth_Highpass::Config
          (ChButterworth_Highpass *this,uint nPoles,double step,double fc)

{
  vector<double,_std::allocator<double>_> *this_00;
  double dVar1;
  undefined1 auVar2 [16];
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  undefined1 auVar10 [16];
  uint uVar11;
  size_type __new_size;
  uint uVar12;
  ulong uVar13;
  size_t i;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  undefined8 in_XMM2_Qb;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  uVar12 = 1;
  if (1 < nPoles) {
    uVar12 = nPoles;
  }
  uVar13 = 6;
  if (uVar12 < 6) {
    uVar13 = (ulong)uVar12;
  }
  this_00 = &this->m_Q;
  this->m_Ts = step;
  uVar12 = (uint)uVar13;
  __new_size = 0;
  if (1 < nPoles) {
    __new_size = uVar13 >> 1;
  }
  uVar11 = uVar12 & 1;
  if (nPoles < 2) {
    uVar11 = 1;
  }
  this->m_n_single = uVar11;
  this->m_n_biquad = (uint)__new_size;
  std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size);
  if (this->m_n_single == 1) {
    uVar13 = 0;
    while (uVar12 - 1 >> 1 != uVar13) {
      auVar15._0_8_ = (double)(int)(uVar13 + 1);
      auVar15._8_8_ = in_XMM2_Qb;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (double)(int)uVar12;
      auVar10 = vfmadd213sd_fma(auVar15,ZEXT816(0x4000000000000000),auVar2);
      dVar14 = cos(((auVar10._0_8_ + -1.0) * 3.141592653589793) / (double)(int)(uVar12 * 2));
      (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
      ._M_start[uVar13] = dVar14 * -2.0;
      uVar13 = uVar13 + 1;
    }
  }
  else {
    uVar13 = (ulong)nPoles + (ulong)(nPoles == 0);
    uVar11 = 6;
    if (uVar13 < 6) {
      uVar11 = (uint)uVar13;
    }
    uVar13 = 0;
    while (uVar11 >> 1 != uVar13) {
      auVar16._0_8_ = (double)(int)(uVar13 + 1);
      auVar16._8_8_ = in_XMM2_Qb;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = (double)(int)uVar12;
      auVar10 = vfmadd213sd_fma(auVar16,ZEXT816(0x4000000000000000),auVar10);
      dVar14 = cos(((auVar10._0_8_ + -1.0) * 3.141592653589793) / (double)(int)(uVar12 * 2));
      (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
      ._M_start[uVar13] = dVar14 * -2.0;
      uVar13 = uVar13 + 1;
    }
  }
  dVar14 = fc * 6.283185307179586;
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_a0,(ulong)this->m_n_biquad);
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_a1,(ulong)this->m_n_biquad);
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_a2,(ulong)this->m_n_biquad);
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_b0,(ulong)this->m_n_biquad);
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_b1,(ulong)this->m_n_biquad);
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_b2,(ulong)this->m_n_biquad);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar14;
  if (this->m_n_single == 1) {
    auVar17._8_8_ = 0;
    auVar17._0_8_ = this->m_Ts;
    auVar10 = vfmadd231sd_fma(ZEXT816(0x4000000000000000),auVar17,auVar25);
    auVar16 = vfmadd213sd_fma(auVar17,auVar25,ZEXT816(0xc000000000000000));
    dVar18 = auVar10._0_8_;
    auVar19._8_8_ = dVar18;
    auVar19._0_8_ = dVar18;
    auVar10 = vdivpd_avx(_DAT_00f62fb0,auVar19);
    this->m_b0 = (double)auVar10._0_8_;
    this->m_b1 = (double)auVar10._8_8_;
    this->m_a1 = auVar16._0_8_ / dVar18;
    this->m_a0 = 1.0;
  }
  uVar12 = this->m_n_biquad;
  pdVar3 = (this->m_biq_b0).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (this->m_biq_b1).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->m_biq_b2).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (this->m_Q).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this->m_biq_a0).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (this->m_biq_a1).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar9 = (this->m_biq_a2).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
    pdVar3[uVar13] = 4.0;
    pdVar4[uVar13] = -8.0;
    pdVar5[uVar13] = 4.0;
    dVar18 = pdVar6[uVar13];
    dVar1 = this->m_Ts;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = dVar14 * dVar1 * (dVar18 + dVar18);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = dVar14 * dVar1 * dVar1;
    auVar10 = vfmadd231sd_fma(auVar20,auVar25,auVar23);
    pdVar7[uVar13] = auVar10._0_8_ + 4.0;
    dVar18 = this->m_Ts;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = dVar14 * dVar18 * (dVar18 + dVar18);
    auVar10 = vfmadd213sd_fma(auVar21,auVar25,ZEXT816(0xc020000000000000));
    pdVar8[uVar13] = auVar10._0_8_;
    dVar18 = this->m_Ts;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar14 * dVar18 * pdVar6[uVar13] * -2.0;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar14 * dVar18 * dVar18;
    auVar10 = vfmadd231sd_fma(auVar22,auVar25,auVar24);
    pdVar9[uVar13] = auVar10._0_8_ + 4.0;
    pdVar3[uVar13] = pdVar3[uVar13] / pdVar7[uVar13];
    pdVar4[uVar13] = pdVar4[uVar13] / pdVar7[uVar13];
    pdVar5[uVar13] = pdVar5[uVar13] / pdVar7[uVar13];
    pdVar8[uVar13] = pdVar8[uVar13] / pdVar7[uVar13];
    pdVar9[uVar13] = pdVar9[uVar13] / pdVar7[uVar13];
    pdVar7[uVar13] = 1.0;
  }
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_u_hist1,(ulong)uVar12);
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_u_hist2,(ulong)this->m_n_biquad)
  ;
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_y_hist1,(ulong)this->m_n_biquad)
  ;
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_y_hist2,(ulong)this->m_n_biquad)
  ;
  Reset(this);
  return;
}

Assistant:

void ChButterworth_Highpass::Config(unsigned int nPoles, double step, double fc) {
    const unsigned int nPolesMin = 1;
    const unsigned int nPolesMax = 6;

    m_Ts = step;
    double wc = fc * CH_C_2PI;

    if (nPoles < nPolesMin) {
        nPoles = 1;
    }
    if (nPoles > nPolesMax) {
        nPoles = nPolesMax;
    }

    if (nPoles == 1) {
        m_n_single = 1;
        m_n_biquad = 0;
    } else {
        m_n_biquad = nPoles / 2;
        m_n_single = nPoles % 2;
    }
    m_Q.resize(m_n_biquad);
    if (m_n_single == 1) {
        for (unsigned int k = 1; k <= (nPoles - 1) / 2; k++) {
            m_Q[k - 1] = -2.0 * cos(CH_C_PI * (2.0 * k + nPoles - 1) / (2.0 * nPoles));
        }
    } else {
        for (unsigned int k = 1; k <= nPoles / 2; k++) {
            m_Q[k - 1] = -2.0 * cos(CH_C_PI * (2.0 * k + nPoles - 1) / (2.0 * nPoles));
        }
    }

    m_biq_a0.resize(m_n_biquad);
    m_biq_a1.resize(m_n_biquad);
    m_biq_a2.resize(m_n_biquad);
    m_biq_b0.resize(m_n_biquad);
    m_biq_b1.resize(m_n_biquad);
    m_biq_b2.resize(m_n_biquad);

    if (m_n_single == 1) {
        m_b0 = 2.0;
        m_b1 = -2.0;

        m_a0 = m_Ts * wc + 2.0;
        m_a1 = m_Ts * wc - 2.0;

        m_b0 /= m_a0;
        m_b1 /= m_a0;
        m_a1 /= m_a0;
        m_a0 = 1.0;
    }
    for (size_t i = 0; i < m_n_biquad; i++) {
        m_biq_b0[i] = 4.0;
        m_biq_b1[i] = -8.0;
        m_biq_b2[i] = 4.0;

        m_biq_a0[i] = m_Ts * m_Ts * wc * wc + 2.0 * m_Q[i] * m_Ts * wc + 4.0;
        m_biq_a1[i] = 2.0 * m_Ts * m_Ts * wc * wc - 8.0;
        m_biq_a2[i] = m_Ts * m_Ts * wc * wc - 2.0 * m_Q[i] * m_Ts * wc + 4.0;

        m_biq_b0[i] /= m_biq_a0[i];
        m_biq_b1[i] /= m_biq_a0[i];
        m_biq_b2[i] /= m_biq_a0[i];

        m_biq_a1[i] /= m_biq_a0[i];
        m_biq_a2[i] /= m_biq_a0[i];
        m_biq_a0[i] = 1.0;
    }
    m_biq_u_hist1.resize(m_n_biquad);
    m_biq_u_hist2.resize(m_n_biquad);
    m_biq_y_hist1.resize(m_n_biquad);
    m_biq_y_hist2.resize(m_n_biquad);

    Reset();
}